

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_importInvalidXml_Test::~Importer_importInvalidXml_Test
          (Importer_importInvalidXml_Test *this)

{
  Importer_importInvalidXml_Test *this_local;
  
  ~Importer_importInvalidXml_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, importInvalidXml)
{
    auto e = "The attempt to import the model at '" + resourcePath("importer/not_even_proper.xml") + "' failed: the file is not valid XML.";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/import_invalid_xml.cellml"));

    importer->resolveImports(model, resourcePath("importer"));
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(e, importer->error(0)->description());
}